

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O0

CMutableTransaction *
BuildSpendingTransaction(CScript *scriptSig,CScriptWitness *scriptWitness,CTransaction *txCredit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Txid *pTVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  CMutableTransaction *in_RDI;
  long in_FS_OFFSET;
  CMutableTransaction *txSpend;
  CTransaction *in_stack_ffffffffffffff58;
  CScript *in_stack_ffffffffffffff60;
  CScript *in_stack_ffffffffffffff68;
  vector<CTxOut,_std::allocator<CTxOut>_> *this;
  size_type in_stack_ffffffffffffff70;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffff78;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffff58);
  in_RDI->version = 1;
  in_RDI->nLockTime = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff68,
             (size_type)in_stack_ffffffffffffff60);
  CScriptWitness::operator=
            ((CScriptWitness *)in_stack_ffffffffffffff68,(CScriptWitness *)in_stack_ffffffffffffff60
            );
  pTVar4 = CTransaction::GetHash(in_stack_ffffffffffffff58);
  pvVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff68,
                      (size_type)in_stack_ffffffffffffff60);
  uVar1 = *(undefined8 *)(pTVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar2 = *(undefined8 *)((pTVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar3 = *(undefined8 *)((pTVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar3;
  *(undefined8 *)(pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar1;
  *(undefined8 *)((pvVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar2;
  pvVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff68,
                      (size_type)in_stack_ffffffffffffff60);
  (pvVar5->prevout).n = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff68,
             (size_type)in_stack_ffffffffffffff60);
  CScript::operator=(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  pvVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff68,
                      (size_type)in_stack_ffffffffffffff60);
  pvVar5->nSequence = 0xffffffff;
  memset(local_28,0,0x20);
  CScript::CScript((CScript *)in_stack_ffffffffffffff58);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff68,
             (size_type)in_stack_ffffffffffffff60);
  CScript::operator=(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  CScript::~CScript((CScript *)in_stack_ffffffffffffff58);
  pvVar6 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff68,
                      (size_type)in_stack_ffffffffffffff60);
  this = (vector<CTxOut,_std::allocator<CTxOut>_> *)pvVar6->nValue;
  pvVar7 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     (this,(size_type)in_stack_ffffffffffffff60);
  pvVar7->nValue = (CAmount)this;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CMutableTransaction BuildSpendingTransaction(const CScript& scriptSig, const CScriptWitness& scriptWitness, const CTransaction& txCredit)
{
    CMutableTransaction txSpend;
    txSpend.version = 1;
    txSpend.nLockTime = 0;
    txSpend.vin.resize(1);
    txSpend.vout.resize(1);
    txSpend.vin[0].scriptWitness = scriptWitness;
    txSpend.vin[0].prevout.hash = txCredit.GetHash();
    txSpend.vin[0].prevout.n = 0;
    txSpend.vin[0].scriptSig = scriptSig;
    txSpend.vin[0].nSequence = CTxIn::SEQUENCE_FINAL;
    txSpend.vout[0].scriptPubKey = CScript();
    txSpend.vout[0].nValue = txCredit.vout[0].nValue;

    return txSpend;
}